

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O2

int __thiscall CVmDynFuncVMIfc::validate_pool_str(CVmDynFuncVMIfc *this,uint32_t ofs)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = CVmPoolInMem::validate_ofs(&G_const_pool_X,ofs);
  uVar2 = 0;
  if (iVar1 != 0) {
    iVar1 = CVmPoolInMem::validate_ofs(&G_const_pool_X,ofs + 1);
    if (iVar1 != 0) {
      iVar1 = CVmPoolInMem::validate_ofs
                        (&G_const_pool_X,
                         ofs + 1 + (uint)*(ushort *)
                                          (G_const_pool_X.super_CVmPoolPaged.pages_
                                           [ofs >> ((byte)G_const_pool_X.super_CVmPoolPaged.
                                                          log2_page_size_ & 0x1f)].mem +
                                          (G_const_pool_X.super_CVmPoolPaged._8_4_ - 1 & ofs)));
      uVar2 = (uint)(iVar1 != 0);
    }
  }
  return uVar2;
}

Assistant:

virtual int validate_pool_str(uint32_t ofs)
    {
        /* establish globals */
        VMGLOB_PTR(vmg);

        /* validate the starting offset and full length prefix */
        if (!G_const_pool->validate_ofs(ofs)
            || !G_const_pool->validate_ofs(ofs+1))
            return FALSE;

        /* get the length */
        size_t len = vmb_get_len(G_const_pool->get_ptr(ofs));

        /* make sure the end of the string is valid as well */
        if (!G_const_pool->validate_ofs(ofs + VMB_LEN + len - 1))
            return FALSE;

        /* success */
        return TRUE;
    }